

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O3

String * __thiscall
kj::anon_unknown_0::percentDecodeQuery
          (String *__return_storage_ptr__,anon_unknown_0 *this,ArrayPtr<const_char> text,
          bool *hadErrors,Options *options)

{
  String *pSVar1;
  char *__dest;
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::Array<unsigned_char>_> local_48;
  
  text_00.ptr = text.ptr;
  if (((ulong)hadErrors & 1) == 0) {
    local_48.super_Array<unsigned_char>.disposer =
         (ArrayDisposer *)heapString(__return_storage_ptr__,(size_t)text_00.ptr);
    if (text_00.ptr != (char *)0x0) {
      __dest = (char *)(__return_storage_ptr__->content).size_;
      if (__dest != (char *)0x0) {
        __dest = (__return_storage_ptr__->content).ptr;
      }
      pSVar1 = (String *)memcpy(__dest,this,(size_t)text_00.ptr);
      return pSVar1;
    }
  }
  else {
    text_00.size_ = 0x101;
    decodeBinaryUriComponent(&local_48,(kj *)this,text_00,SUB82(hadErrors,0));
    if ((String *)local_48.super_Array<unsigned_char>.disposer == (String *)0x0) {
      local_48.super_Array<unsigned_char>.ptr = (uchar *)0x0;
      local_48.super_Array<unsigned_char>.size_ = 0;
    }
    if (local_48.hadErrors != false) {
      *(undefined1 *)text.size_ = 1;
    }
    (__return_storage_ptr__->content).ptr = (char *)local_48.super_Array<unsigned_char>.ptr;
    (__return_storage_ptr__->content).size_ = local_48.super_Array<unsigned_char>.size_;
    (__return_storage_ptr__->content).disposer = local_48.super_Array<unsigned_char>.disposer;
  }
  return (String *)local_48.super_Array<unsigned_char>.disposer;
}

Assistant:

String percentDecodeQuery(ArrayPtr<const char> text, bool& hadErrors, const Url::Options& options) {
  if (options.percentDecode) {
    auto result = decodeWwwForm(text);
    if (result.hadErrors) hadErrors = true;
    return kj::mv(result);
  }
  return kj::str(text);
}